

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall irr::video::COpenGLDriver::setMaterial(COpenGLDriver *this,SMaterial *material)

{
  undefined4 *puVar1;
  ITexture *texture;
  long lVar2;
  u32 i;
  ulong uVar3;
  
  SMaterial::operator=(&this->Material,material);
  SOverrideMaterial::apply(&(this->super_CNullDriver).OverrideMaterial,&this->Material);
  lVar2 = 0xdf8;
  for (uVar3 = 0; uVar3 < (byte)this->field_0x6c3; uVar3 = uVar3 + 1) {
    if (uVar3 < 4) {
      texture = *(ITexture **)
                 ((long)&(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver + lVar2);
    }
    else {
      texture = (ITexture *)0x0;
    }
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::set
              (&(this->CacheHandler->
                super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                ).TextureCache,(u32)uVar3,texture,EST_ACTIVE_ON_CHANGE);
    if (texture != (ITexture *)0x0) {
      puVar1 = &core::IdentityMatrix;
      if ((uVar3 < 4) &&
         (puVar1 = *(undefined4 **)((long)material + lVar2 + -0xde0), puVar1 == (undefined4 *)0x0))
      {
        puVar1 = &core::IdentityMatrix;
      }
      (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[6])
                (this,(ulong)((u32)uVar3 + 3),puVar1);
    }
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

void COpenGLDriver::setMaterial(const SMaterial &material)
{
	Material = material;
	OverrideMaterial.apply(Material);

	for (u32 i = 0; i < Feature.MaxTextureUnits; ++i) {
		const ITexture *texture = Material.getTexture(i);
		CacheHandler->getTextureCache().set(i, texture, EST_ACTIVE_ON_CHANGE);
		if (texture) {
			setTransform((E_TRANSFORMATION_STATE)(ETS_TEXTURE_0 + i), material.getTextureMatrix(i));
		}
	}
}